

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O0

char * hts_idx_getfn(char *fn,char *ext)

{
  size_t sVar1;
  char *local_40;
  char *ret;
  char *fnidx;
  int l_ext;
  int l_fn;
  int i;
  char *ext_local;
  char *fn_local;
  
  sVar1 = strlen(fn);
  l_ext = (int)sVar1;
  sVar1 = strlen(ext);
  fn_local = (char *)calloc((long)(l_ext + (int)sVar1 + 1),1);
  strcpy(fn_local,fn);
  strcpy(fn_local + l_ext,ext);
  local_40 = test_and_fetch(fn_local);
  if (local_40 == (char *)0x0) {
    do {
      l_ext = l_ext + -1;
      if (l_ext < 1) break;
    } while (fn_local[l_ext] != '.');
    strcpy(fn_local + l_ext,ext);
    local_40 = test_and_fetch(fn_local);
  }
  if (local_40 == (char *)0x0) {
    free(fn_local);
    fn_local = (char *)0x0;
  }
  else {
    sVar1 = strlen(local_40);
    memmove(fn_local,local_40,(long)((int)sVar1 + 1));
  }
  return fn_local;
}

Assistant:

char *hts_idx_getfn(const char *fn, const char *ext)
{
    int i, l_fn, l_ext;
    char *fnidx, *ret;
    l_fn = strlen(fn); l_ext = strlen(ext);
    fnidx = (char*)calloc(l_fn + l_ext + 1, 1);
    strcpy(fnidx, fn); strcpy(fnidx + l_fn, ext);
    if ((ret = test_and_fetch(fnidx)) == 0) {
        for (i = l_fn - 1; i > 0; --i)
            if (fnidx[i] == '.') break;
        strcpy(fnidx + i, ext);
        ret = test_and_fetch(fnidx);
    }
    if (ret == 0) {
        free(fnidx);
        return 0;
    }
    l_fn = strlen(ret);
    memmove(fnidx, ret, l_fn + 1);
    return fnidx;
}